

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_write_set_option.c
# Opt level: O3

void test(int pristine)

{
  longlong v1;
  int iVar1;
  archive *_a;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  wchar_t wVar5;
  
  _a = archive_write_new();
  v1 = -0x19;
  if (pristine == 0) {
    archive_write_add_filter_gzip(_a);
    archive_write_set_format_iso9660(_a);
    v1 = 0;
  }
  iVar1 = archive_write_set_options(_a,(char *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'.',0,"0",(long)iVar1,"archive_write_set_options(a, ((void*)0))",(void *)0x0
                     );
  iVar1 = archive_write_set_options(_a,"");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'/',0,"0",(long)iVar1,"archive_write_set_options(a, \"\")",(void *)0x0);
  iVar1 = archive_write_set_options(_a,"fubar:snafu");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'2',-0x19,"(-25)",(long)iVar1,
                      "archive_write_set_options(a, \"fubar:snafu\")",(void *)0x0);
  pcVar2 = archive_error_string(_a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
             ,L'4',"Unknown module name: `fubar\'","\"Unknown module name: `fubar\'\"",pcVar2,
             "archive_error_string(a)",(void *)0x0,L'\0');
  iVar1 = archive_write_set_options(_a,"fubar:snafu=betcha");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'5',-0x19,"(-25)",(long)iVar1,
                      "archive_write_set_options(a, \"fubar:snafu=betcha\")",(void *)0x0);
  pcVar2 = archive_error_string(_a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
             ,L'7',"Unknown module name: `fubar\'","\"Unknown module name: `fubar\'\"",pcVar2,
             "archive_error_string(a)",(void *)0x0,L'\0');
  iVar1 = archive_write_set_options(_a,"snafu");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L':',-0x19,"(-25)",(long)iVar1,"archive_write_set_options(a, \"snafu\")",
                      (void *)0x0);
  pcVar2 = archive_error_string(_a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
             ,L'<',"Undefined option: `snafu\'","\"Undefined option: `snafu\'\"",pcVar2,
             "archive_error_string(a)",(void *)0x0,L'\0');
  iVar1 = archive_write_set_options(_a,"snafu=betcha");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'=',-0x19,"(-25)",(long)iVar1,
                      "archive_write_set_options(a, \"snafu=betcha\")",(void *)0x0);
  pcVar2 = archive_error_string(_a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
             ,L'?',"Undefined option: `snafu\'","\"Undefined option: `snafu\'\"",pcVar2,
             "archive_error_string(a)",(void *)0x0,L'\0');
  iVar1 = archive_write_set_options(_a,"iso9660:joliet");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'B',v1,"known_option_rv",(long)iVar1,
                      "archive_write_set_options(a, \"iso9660:joliet\")",(void *)0x0);
  if (pristine == 0) {
    iVar1 = archive_write_set_options(_a,"iso9660:joliet");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                        ,L'G',0,"known_option_rv",(long)iVar1,
                        "archive_write_set_options(a, \"iso9660:joliet\")",(void *)0x0);
  }
  else {
    pcVar2 = archive_error_string(_a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
               ,L'E',"Unknown module name: `iso9660\'","\"Unknown module name: `iso9660\'\"",pcVar2,
               "archive_error_string(a)",(void *)0x0,L'\0');
    iVar1 = archive_write_set_options(_a,"iso9660:joliet");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                        ,L'G',-0x19,"known_option_rv",(long)iVar1,
                        "archive_write_set_options(a, \"iso9660:joliet\")",(void *)0x0);
    pcVar2 = archive_error_string(_a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
               ,L'J',"Unknown module name: `iso9660\'","\"Unknown module name: `iso9660\'\"",pcVar2,
               "archive_error_string(a)",(void *)0x0,L'\0');
  }
  iVar1 = archive_write_set_options(_a,"joliet");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'L',v1,"known_option_rv",(long)iVar1,
                      "archive_write_set_options(a, \"joliet\")",(void *)0x0);
  if (pristine == 0) {
    iVar1 = archive_write_set_options(_a,"!joliet");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                        ,L'Q',0,"known_option_rv",(long)iVar1,
                        "archive_write_set_options(a, \"!joliet\")",(void *)0x0);
  }
  else {
    pcVar2 = archive_error_string(_a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
               ,L'O',"Undefined option: `joliet\'","\"Undefined option: `joliet\'\"",pcVar2,
               "archive_error_string(a)",(void *)0x0,L'\0');
    iVar1 = archive_write_set_options(_a,"!joliet");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                        ,L'Q',-0x19,"known_option_rv",(long)iVar1,
                        "archive_write_set_options(a, \"!joliet\")",(void *)0x0);
    pcVar2 = archive_error_string(_a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
               ,L'T',"Undefined option: `joliet\'","\"Undefined option: `joliet\'\"",pcVar2,
               "archive_error_string(a)",(void *)0x0,L'\0');
  }
  iVar1 = archive_write_set_options(_a,",");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'W',0,"0",(long)iVar1,"archive_write_set_options(a, \",\")",(void *)0x0);
  iVar1 = archive_write_set_options(_a,",,");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'X',0,"0",(long)iVar1,"archive_write_set_options(a, \",,\")",(void *)0x0);
  iVar1 = archive_write_set_options(_a,",joliet");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'Z',v1,"halfempty_options_rv",(long)iVar1,
                      "archive_write_set_options(a, \",joliet\")",(void *)0x0);
  if (pristine == 0) {
    iVar1 = archive_write_set_options(_a,"joliet,");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                        ,L'_',0,"halfempty_options_rv",(long)iVar1,
                        "archive_write_set_options(a, \"joliet,\")",(void *)0x0);
  }
  else {
    pcVar2 = archive_error_string(_a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
               ,L']',"Undefined option: `joliet\'","\"Undefined option: `joliet\'\"",pcVar2,
               "archive_error_string(a)",(void *)0x0,L'\0');
    iVar1 = archive_write_set_options(_a,"joliet,");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                        ,L'_',-0x19,"halfempty_options_rv",(long)iVar1,
                        "archive_write_set_options(a, \"joliet,\")",(void *)0x0);
    pcVar2 = archive_error_string(_a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
               ,L'b',"Undefined option: `joliet\'","\"Undefined option: `joliet\'\"",pcVar2,
               "archive_error_string(a)",(void *)0x0,L'\0');
  }
  iVar1 = archive_write_set_options(_a,"joliet,snafu");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'e',-0x19,"(-25)",(long)iVar1,
                      "archive_write_set_options(a, \"joliet,snafu\")",(void *)0x0);
  pcVar2 = archive_error_string(_a);
  if (pristine == 0) {
    pcVar4 = "Undefined option: `snafu\'";
    pcVar3 = "\"Undefined option: `snafu\'\"";
    wVar5 = L'k';
  }
  else {
    pcVar4 = "Undefined option: `joliet\'";
    pcVar3 = "\"Undefined option: `joliet\'\"";
    wVar5 = L'h';
  }
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
             ,wVar5,pcVar4,pcVar3,pcVar2,"archive_error_string(a)",(void *)0x0,L'\0');
  iVar1 = archive_write_set_options(_a,"iso9660:snafu");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'n',-0x19,"(-25)",(long)iVar1,
                      "archive_write_set_options(a, \"iso9660:snafu\")",(void *)0x0);
  pcVar2 = archive_error_string(_a);
  if (pristine == 0) {
    pcVar4 = "Undefined option: `iso9660:snafu\'";
    pcVar3 = "\"Undefined option: `iso9660:snafu\'\"";
    wVar5 = L't';
  }
  else {
    pcVar4 = "Unknown module name: `iso9660\'";
    pcVar3 = "\"Unknown module name: `iso9660\'\"";
    wVar5 = L'q';
  }
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
             ,wVar5,pcVar4,pcVar3,pcVar2,"archive_error_string(a)",(void *)0x0,L'\0');
  archive_write_free(_a);
  return;
}

Assistant:

static void
test(int pristine)
{
	struct archive* a = archive_write_new();
	int known_option_rv = pristine ? ARCHIVE_FAILED : ARCHIVE_OK;

	if (!pristine) {
		archive_write_add_filter_gzip(a);
		archive_write_set_format_iso9660(a);
        }

	/* NULL and "" denote `no option', so they're ok no matter
	 * what, if any, formats are registered */
	should(a, ARCHIVE_OK, NULL, NULL, NULL);
	should(a, ARCHIVE_OK, "", "", "");

	/* unknown modules and options */
	should(a, ARCHIVE_FAILED, "fubar", "snafu", NULL);
	should(a, ARCHIVE_FAILED, "fubar", "snafu", "betcha");

	/* unknown modules and options */
	should(a, ARCHIVE_FAILED, NULL, "snafu", NULL);
	should(a, ARCHIVE_FAILED, NULL, "snafu", "betcha");

	/* ARCHIVE_OK with iso9660 loaded, ARCHIVE_WARN otherwise */
	should(a, known_option_rv, "iso9660", "joliet", NULL);
	should(a, known_option_rv, "iso9660", "joliet", NULL);
	should(a, known_option_rv, NULL, "joliet", NULL);
	should(a, known_option_rv, NULL, "joliet", NULL);

	archive_write_free(a);
}